

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int Dau_DsdLevelVar(void *pMan,int iVar)

{
  int local_30;
  int local_2c;
  int Level;
  int LevelMax;
  char *pStr;
  Dau_Dsd_t *p;
  int iVar_local;
  void *pMan_local;
  
  local_2c = 0;
  for (_Level = (char *)((long)pMan + (long)iVar * 8 + 0x28); *_Level != '\0'; _Level = _Level + 1)
  {
    if (((int)*_Level < *pMan + 0x61) || (*(int *)((long)pMan + 4) + 0x61 <= (int)*_Level)) {
      local_30 = *(int *)(*(long *)((long)pMan + 0x20) + (long)(*_Level + -0x61) * 4);
    }
    else {
      local_30 = Dau_DsdLevelVar(pMan,*_Level + -0x61);
      local_30 = local_30 + 1;
    }
    local_2c = Abc_MaxInt(local_2c,local_30);
  }
  return local_2c;
}

Assistant:

int Dau_DsdLevelVar( void * pMan, int iVar )
{
    Dau_Dsd_t * p = (Dau_Dsd_t *)pMan;
    char * pStr;
    int LevelMax = 0, Level;
    for ( pStr = p->pVarDefs[iVar]; *pStr; pStr++ )
    {
        if ( *pStr >= 'a' + p->nVarsInit && *pStr < 'a' + p->nVarsUsed )
            Level = 1 + Dau_DsdLevelVar( p, *pStr - 'a' );
        else
            Level = p->pVarLevels[*pStr - 'a'];
        LevelMax = Abc_MaxInt( LevelMax, Level );
    }
    return LevelMax;
}